

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int CmdCommandStarter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uint local_44;
  char *local_40;
  
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_44 = 3;
  bVar1 = false;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"NCvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (iVar3 == -1) {
        if (globalUtilOptind + 1 == argc) {
          pcVar4 = argv[globalUtilOptind];
          __stream = (FILE *)Io_FileOpen(pcVar4,"open_path","rb",0);
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
            Cmd_RunStarter(pcVar4,pAbc->sBinary,local_40,local_44);
            return 0;
          }
          Abc_Print(-2,"Cannot open input file \"%s\". ",pcVar4);
          pcVar4 = Extra_FileGetSimilarName(pcVar4,".c",".s",".scr",".script",(char *)0x0);
          if (pcVar4 != (char *)0x0) {
            Abc_Print(-2,"Did you mean \"%s\"?",pcVar4);
          }
          pcVar4 = "\n";
        }
        else {
          pcVar4 = "The file name should be given on the command line.\n";
        }
        goto LAB_002bbfbd;
      }
      if (iVar3 != 0x43) break;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n"
        ;
LAB_002bbf1f:
        Abc_Print(-1,pcVar4);
        goto LAB_002bbf2b;
      }
      local_40 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    if (iVar3 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_002bbf1f;
    }
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)local_44);
LAB_002bbf2b:
  Abc_Print(-2,"usage: starter [-N num] [-C cmd] [-vh] <file>\n");
  Abc_Print(-2,"\t         runs command lines listed in <file> concurrently on <num> CPUs\n");
  Abc_Print(-2,"\t-N num : the number of concurrent jobs including the controler [default = %d]\n",
            (ulong)local_44);
  Abc_Print(-2,"\t-C cmd : (optional) ABC command line to execute on benchmarks in <file>\n");
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  pcVar4 = "\t<file> : file name with ABC command lines (or benchmark names, if <cmd> is given)\n";
LAB_002bbfbd:
  Abc_Print(-2,pcVar4);
  return 1;
}

Assistant:

int CmdCommandStarter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Cmd_RunStarter( char * pFileName, char * pBinary, char * pCommand, int nCores );
    FILE * pFile;
    char * pFileName;
    char * pCommand = NULL;
    int c, nCores    =  3;
    int fVerbose     =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCores = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCores < 0 ) 
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n" );
                goto usage;
            }
            pCommand = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -2, "The file name should be given on the command line.\n" );
        return 1;
    }
    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "rb", 0 )) == NULL )
//    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        Abc_Print( -2, "Cannot open input file \"%s\". ", pFileName );
        if (( pFileName = Extra_FileGetSimilarName( pFileName, ".c", ".s", ".scr", ".script", NULL ) ))
            Abc_Print( -2, "Did you mean \"%s\"?", pFileName );
        Abc_Print( -2, "\n" );
        return 1;
    }
    fclose( pFile );
    // run commands
    Cmd_RunStarter( pFileName, pAbc->sBinary, pCommand, nCores );
    return 0;

usage:
    Abc_Print( -2, "usage: starter [-N num] [-C cmd] [-vh] <file>\n" );
    Abc_Print( -2, "\t         runs command lines listed in <file> concurrently on <num> CPUs\n" );
    Abc_Print( -2, "\t-N num : the number of concurrent jobs including the controler [default = %d]\n", nCores );
    Abc_Print( -2, "\t-C cmd : (optional) ABC command line to execute on benchmarks in <file>\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with ABC command lines (or benchmark names, if <cmd> is given)\n");
    return 1;
}